

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# character.cpp
# Opt level: O3

void __thiscall
LiteScript::_Type_CHARACTER::Save
          (_Type_CHARACTER *this,ostream *stream,Object *object,offset_in_Memory_to_subr caller)

{
  void *pvVar1;
  Object *pOVar2;
  long in_R8;
  long *plVar3;
  char local_34;
  char local_33;
  char local_32;
  char local_31;
  
  pvVar1 = object->data;
  std::__ostream_insert<char,std::char_traits<char>>(stream,&local_33,1);
  std::__ostream_insert<char,std::char_traits<char>>(stream,&local_34,1);
  std::__ostream_insert<char,std::char_traits<char>>(stream,&local_32,1);
  std::__ostream_insert<char,std::char_traits<char>>(stream,&local_31,1);
  plVar3 = (long *)((long)(object->memory->arr)._M_elems + in_R8);
  if ((caller & 1) != 0) {
    caller = *(undefined8 *)(*plVar3 + -1 + caller);
  }
  pOVar2 = Variable::operator->((Variable *)((long)pvVar1 + 0x10));
  (*(code *)caller)(plVar3,stream,pOVar2->ID);
  return;
}

Assistant:

void LiteScript::_Type_CHARACTER::Save(std::ostream &stream, Object &object, bool (Memory::*caller)(std::ostream&, unsigned int)) const {
    Character& C = object.GetData<Character>();
    OStreamer::Write<unsigned int>(stream, C.Index);
    (object.memory.*caller)(stream, (*C.obj_string)->ID);
}